

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O2

void __thiscall KalahaState<(short)6>::do_move(KalahaState<(short)6> *this,Move move)

{
  short sVar1;
  short *psVar2;
  int iVar3;
  ushort uVar4;
  long lVar6;
  char *expr;
  ulong uVar7;
  ulong uVar8;
  short *psVar9;
  ulong uVar10;
  short m;
  short sVar11;
  long lVar12;
  ulong uVar13;
  short sVar5;
  
  if (this->player_must_pass == true) {
    if (move == -1) {
      this->player_must_pass = false;
      iVar3 = this->player_to_move;
LAB_0010e1dc:
      this->player_to_move = 3 - iVar3;
      return;
    }
    expr = "move == pass_move";
    iVar3 = 0x25;
  }
  else if ((ushort)move < 6) {
    iVar3 = this->player_to_move;
    psVar9 = this->player2_bins;
    psVar2 = this->player1_bins;
    if (iVar3 == 1) {
      psVar9 = this->player1_bins;
      psVar2 = this->player2_bins;
    }
    uVar8 = (ulong)(ushort)psVar9[(ushort)move];
    if (0 < psVar9[(ushort)move]) {
      lVar6 = (long)move;
      uVar7 = (ulong)(iVar3 != 1);
      psVar9[(ushort)move] = 0;
      while (sVar5 = (short)uVar8, 0 < sVar5) {
        uVar10 = 4 - lVar6;
        for (lVar12 = 0; (sVar11 = (short)lVar12, (int)move + (int)lVar12 < 5 && (sVar5 != sVar11));
            lVar12 = lVar12 + 1) {
          sVar1 = psVar9[lVar6 + lVar12 + 1];
          psVar9[lVar6 + lVar12 + 1] = sVar1 + 1;
          if (((short)(sVar5 + -1) == sVar11) && (sVar1 == 0)) {
            this->player2_bins[uVar7 + 6] =
                 psVar2[uVar10 & 0xffffffff] + this->player2_bins[uVar7 + 6] + 1;
            psVar9[lVar6 + lVar12 + 1] = 0;
            psVar2[uVar10 & 0xffffffff] = 0;
          }
          uVar10 = uVar10 - 1;
        }
        if (sVar5 == sVar11) break;
        this->player2_bins[uVar7 + 6] = this->player2_bins[uVar7 + 6] + 1;
        if ((short)(sVar5 + -1) == sVar11) {
          this->player_must_pass = true;
          break;
        }
        uVar10 = ((uVar8 & 0xffff) - lVar12) + 0xffff;
        uVar13 = 0;
        uVar8 = uVar10 & 0xffffffff;
        while( true ) {
          sVar5 = (short)uVar10;
          uVar4 = sVar5 - 1;
          uVar10 = (ulong)uVar4;
          if ((5 < uVar13) || (sVar5 == 0)) break;
          psVar2[uVar13] = psVar2[uVar13] + 1;
          uVar13 = uVar13 + 1;
          uVar8 = (ulong)uVar4;
        }
      }
      goto LAB_0010e1dc;
    }
    expr = "lower_bins[move] > 0";
    iVar3 = 0x2e;
  }
  else {
    expr = "0 <= move && move < num_bins";
    iVar3 = 0x2b;
  }
  MCTS::assertion_failed
            (expr,
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
             ,iVar3);
}

Assistant:

void do_move(Move move)
	{
		if (player_must_pass) {
			attest(move == pass_move);
			player_must_pass = false;
			player_to_move = 3 - player_to_move;
			return;
		}

		attest(0 <= move && move < num_bins);
		short* upper_bins = player_to_move == 1 ? player2_bins : player1_bins;
		short* lower_bins = player_to_move == 1 ? player1_bins : player2_bins;
		attest(lower_bins[move] > 0);
		auto seeds = lower_bins[move];
		lower_bins[move] = 0;

		short* lower_store = player_to_move == 1 ? &player1_store : &player2_store;

		while (seeds > 0) {
			// Move along lower bins.
			for (auto m = move + 1; m < num_bins && seeds > 0; ++m) {
				lower_bins[m] += 1;
				seeds -= 1;

				if (seeds == 0) {
					// Land in an empty square with opposite markers?
					auto opposite = num_bins - 1 - m;
					if (lower_bins[m] == 1 /* && upper_bins[opposite] > 0 */) { // Allow null capture?
						// Capture everything
						*lower_store += lower_bins[m] + upper_bins[opposite];
						lower_bins[m] = 0;
						upper_bins[opposite] = 0;
					}
				}
			}

			if (seeds == 0) {
				break;
			}

			// Put a seed in the store.
			*lower_store += 1;
			seeds -= 1;
			if (seeds == 0) {
				// Last seed in store; gets an extra turn.
				player_must_pass = true;
				break;
			}

			// Move along upper bins.
			for (short m = 0; m < num_bins && seeds > 0; ++m) {
				upper_bins[m] += 1;
				seeds -= 1;
			}
		}

		player_to_move = 3 - player_to_move;
	}